

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O0

bool __thiscall glu::TryCompileProgram::operator()(TryCompileProgram *this,RenderContext *context)

{
  char *pcVar1;
  bool bVar2;
  ProgramSources *pPVar3;
  allocator<char> local_261;
  string local_260;
  ShaderSource local_240;
  allocator<char> local_201;
  string local_200;
  ShaderSource local_1e0;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  RenderContext *context_local;
  TryCompileProgram *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)context;
  ProgramSources::ProgramSources(&local_1b8);
  pcVar1 = this->m_vertexSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,pcVar1,&local_201);
  VertexSource::VertexSource((VertexSource *)&local_1e0,&local_200);
  pPVar3 = ProgramSources::operator<<(&local_1b8,&local_1e0);
  pcVar1 = this->m_fragmentSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,pcVar1,&local_261);
  FragmentSource::FragmentSource((FragmentSource *)&local_240,&local_260);
  pPVar3 = ProgramSources::operator<<(pPVar3,&local_240);
  ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,context,pPVar3);
  FragmentSource::~FragmentSource((FragmentSource *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  VertexSource::~VertexSource((VertexSource *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  ProgramSources::~ProgramSources(&local_1b8);
  bVar2 = ShaderProgram::isOk((ShaderProgram *)local_e8);
  ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
  return bVar2;
}

Assistant:

bool operator() (const RenderContext& context) const
	{
		ShaderProgram program(context,
			ProgramSources() << VertexSource(m_vertexSource)
							 << FragmentSource(m_fragmentSource));
		return program.isOk();
	}